

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O3

int Aig_ManCleanup(Aig_Man_t *p)

{
  undefined8 uVar1;
  uint *__ptr;
  void *pvVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int local_38;
  int local_34;
  
  local_38 = p->nObjs[5];
  local_34 = p->nObjs[6];
  uVar1 = *(undefined8 *)(p->nObjs + 5);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar2 = malloc(800);
  *(void **)(__ptr + 2) = pvVar2;
  pVVar4 = p->vObjs;
  if (pVVar4->nSize < 1) {
LAB_00633c43:
    if (pvVar2 == (void *)0x0) goto LAB_00633c50;
  }
  else {
    uVar9 = 0;
    uVar7 = 100;
    lVar8 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar8];
      if (((pvVar2 != (void *)0x0) && (*(uint *)((long)pvVar2 + 0x18) < 0x40)) &&
         ((*(uint *)((long)pvVar2 + 0x18) & 7) - 5 < 2)) {
        uVar6 = (uint)uVar7;
        if (uVar9 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(0x80);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar3;
            *__ptr = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uVar6 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(uVar7 * 8);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),uVar7 * 8);
            }
            *(void **)(__ptr + 2) = pvVar3;
            *__ptr = uVar6 * 2;
          }
        }
        else {
          pvVar3 = *(void **)(__ptr + 2);
        }
        lVar5 = (long)(int)uVar9;
        uVar9 = uVar9 + 1;
        __ptr[1] = uVar9;
        *(void **)((long)pvVar3 + lVar5 * 8) = pvVar2;
        pVVar4 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar4->nSize);
    pvVar2 = *(void **)(__ptr + 2);
    local_38 = (int)uVar1;
    local_34 = (int)((ulong)uVar1 >> 0x20);
    if ((int)uVar9 < 1) goto LAB_00633c43;
    uVar7 = 0;
    do {
      Aig_ObjDelete_rec(p,*(Aig_Obj_t **)((long)pvVar2 + uVar7 * 8),1);
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  free(pvVar2);
LAB_00633c50:
  free(__ptr);
  return (local_34 + local_38) - (p->nObjs[5] + p->nObjs[6]);
}

Assistant:

int Aig_ManCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pNode;
    int i, nNodesOld = Aig_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Aig_ManForEachObj( p, pNode, i )
        if ( Aig_ObjIsNode(pNode) && Aig_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pNode, i )
        Aig_ObjDelete_rec( p, pNode, 1 );
    Vec_PtrFree( vObjs );
    return nNodesOld - Aig_ManNodeNum(p);
}